

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structs.c
# Opt level: O3

ulp_public_key * ulp_alloc_public_key(size_t n,size_t l)

{
  ulp_public_key *__ptr;
  uint64_t *__ptr_00;
  uint64_t *__ptr_01;
  
  __ptr = (ulp_public_key *)malloc(0x30);
  if (__ptr != (ulp_public_key *)0x0) {
    __ptr->n = n;
    __ptr->l = l;
    __ptr_00 = (uint64_t *)malloc(n * n * 8);
    __ptr->A = __ptr_00;
    __ptr_01 = (uint64_t *)malloc(n * 8 * l);
    __ptr->P = __ptr_01;
    if (__ptr_00 != (uint64_t *)0x0 && __ptr_01 != (uint64_t *)0x0) {
      return __ptr;
    }
    free(__ptr_00);
    free(__ptr_01);
    free(__ptr);
  }
  return (ulp_public_key *)0x0;
}

Assistant:

ulp_public_key* ulp_alloc_public_key(size_t n, size_t l) {
    ulp_public_key* key = malloc(sizeof(ulp_public_key));
    if(key == NULL)
        return NULL;
    key->n = n;
    key->l = l;
    key->A = malloc(n*n*sizeof(key->q));
    key->P = malloc(l*n*sizeof(key->q));
    if(key->A == NULL || key->P == NULL) {
        free(key->A);
        free(key->P);
        free(key);
        return NULL;
    }
    return key;
}